

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O2

Vertex * __thiscall
TRM::ObjectHeap::Allocate<TRM::Vertex,glm::vec<2,float,(glm::qualifier)0>const&>
          (ObjectHeap *this,vec<2,_float,_(glm::qualifier)0> *args)

{
  vec<2,_float,_(glm::qualifier)0> in_RAX;
  pointer *__ptr;
  vec<2,_float,_(glm::qualifier)0> local_18;
  
  local_18 = in_RAX;
  std::make_unique<TRM::Vertex,glm::vec<2,float,(glm::qualifier)0>const&>(&local_18);
  std::
  vector<std::unique_ptr<TRM::Object,std::default_delete<TRM::Object>>,std::allocator<std::unique_ptr<TRM::Object,std::default_delete<TRM::Object>>>>
  ::emplace_back<std::unique_ptr<TRM::Vertex,std::default_delete<TRM::Vertex>>>
            ((vector<std::unique_ptr<TRM::Object,std::default_delete<TRM::Object>>,std::allocator<std::unique_ptr<TRM::Object,std::default_delete<TRM::Object>>>>
              *)this,(unique_ptr<TRM::Vertex,_std::default_delete<TRM::Vertex>_> *)&local_18);
  if (local_18 != (vec<2,_float,_(glm::qualifier)0>)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  return (Vertex *)
         (this->objs_).
         super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<TRM::Object,_std::default_delete<TRM::Object>_>._M_t.
         super__Tuple_impl<0UL,_TRM::Object_*,_std::default_delete<TRM::Object>_>.
         super__Head_base<0UL,_TRM::Object_*,_false>._M_head_impl;
}

Assistant:

T* Allocate(Args&&... args) {
    objs_.emplace_back(std::make_unique<T>(std::forward<Args>(args)...));

    return static_cast<T*>(objs_.back().get());
  }